

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.cpp
# Opt level: O3

ZSTD_CCtx * duckdb_zstd::ZSTD_initStaticCCtx(void *workspace,size_t workspaceSize)

{
  ulong uVar1;
  uint *puVar2;
  void *alloc_1;
  long lVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  void *alloc;
  
  if ((((ulong)workspace & 7) == 0 && 0x1480 < workspaceSize) &&
     (workspace != (void *)0x0 && 0x147f < (long)workspaceSize)) {
    uVar6 = (long)workspace + 0x1480;
    uVar1 = (long)workspace + workspaceSize;
    uVar7 = uVar1 & 0xffffffffffffffc0;
    memset(workspace,0,0x1480);
    *(void **)((long)workspace + 0x2a8) = workspace;
    *(ulong *)((long)workspace + 0x2b0) = uVar1;
    *(ulong *)((long)workspace + 0x2b8) = uVar6;
    *(ulong *)((long)workspace + 0x2c0) = uVar6;
    *(ulong *)((long)workspace + 0x2c8) = uVar6;
    *(ulong *)((long)workspace + 0x2d0) = uVar7;
    *(ulong *)((long)workspace + 0x2d8) = uVar7;
    *(undefined4 *)((long)workspace + 0x2e4) = 0;
    *(undefined4 *)((long)workspace + 0x2ec) = 1;
    *(size_t *)((long)workspace + 0x388) = workspaceSize;
    if (0x4ed7 < uVar7 - uVar6) {
      if (workspaceSize < 0x2a80) {
        *(undefined1 *)((long)workspace + 0x2e0) = 1;
        uVar7 = uVar6;
        uVar6 = 0;
      }
      else {
        uVar7 = (long)workspace + 0x2a80;
        *(ulong *)((long)workspace + 0x2b8) = uVar7;
        *(ulong *)((long)workspace + 0x2c0) = uVar7;
        *(ulong *)((long)workspace + 0x2c8) = uVar7;
      }
      *(ulong *)((long)workspace + 0xc80) = uVar6;
      uVar6 = uVar7 + 0x1600;
      if (uVar1 < uVar6) {
        *(undefined1 *)((long)workspace + 0x2e0) = 1;
        lVar3 = 0x22d8;
        uVar6 = uVar7;
        uVar5 = 0;
      }
      else {
        *(ulong *)((long)workspace + 0x2b8) = uVar6;
        *(ulong *)((long)workspace + 0x2c0) = uVar6;
        *(ulong *)((long)workspace + 0x2c8) = uVar6;
        lVar3 = 0x38d8;
        uVar5 = uVar7;
      }
      uVar7 = uVar7 + lVar3;
      *(ulong *)((long)workspace + 0xc88) = uVar5;
      if (uVar1 < uVar7) {
        *(undefined1 *)((long)workspace + 0x2e0) = 1;
        uVar6 = 0;
      }
      else {
        *(ulong *)((long)workspace + 0x2b8) = uVar7;
        *(ulong *)((long)workspace + 0x2c0) = uVar7;
        *(ulong *)((long)workspace + 0x2c8) = uVar7;
      }
      *(ulong *)((long)workspace + 0xdc0) = uVar6;
      puVar2 = (uint *)cpuid_basic_info(0);
      uVar4 = 0;
      if ((*puVar2 != 0) && (uVar4 = 0, 6 < *puVar2)) {
        lVar3 = cpuid_Extended_Feature_Enumeration_info(7);
        uVar4 = *(uint *)(lVar3 + 4) >> 8 & 1;
      }
      *(uint *)((long)workspace + 8) = uVar4;
      return (ZSTD_CCtx *)workspace;
    }
  }
  return (ZSTD_CCtx *)0x0;
}

Assistant:

ZSTD_CCtx* ZSTD_initStaticCCtx(void* workspace, size_t workspaceSize)
{
    ZSTD_cwksp ws;
    ZSTD_CCtx* cctx;
    if (workspaceSize <= sizeof(ZSTD_CCtx)) return NULL;  /* minimum size */
    if ((size_t)workspace & 7) return NULL;  /* must be 8-aligned */
    ZSTD_cwksp_init(&ws, workspace, workspaceSize, ZSTD_cwksp_static_alloc);

    cctx = (ZSTD_CCtx*)ZSTD_cwksp_reserve_object(&ws, sizeof(ZSTD_CCtx));
    if (cctx == NULL) return NULL;

    ZSTD_memset(cctx, 0, sizeof(ZSTD_CCtx));
    ZSTD_cwksp_move(&cctx->workspace, &ws);
    cctx->staticSize = workspaceSize;

    /* statically sized space. entropyWorkspace never moves (but prev/next block swap places) */
    if (!ZSTD_cwksp_check_available(&cctx->workspace, ENTROPY_WORKSPACE_SIZE + 2 * sizeof(ZSTD_compressedBlockState_t))) return NULL;
    cctx->blockState.prevCBlock = (ZSTD_compressedBlockState_t*)ZSTD_cwksp_reserve_object(&cctx->workspace, sizeof(ZSTD_compressedBlockState_t));
    cctx->blockState.nextCBlock = (ZSTD_compressedBlockState_t*)ZSTD_cwksp_reserve_object(&cctx->workspace, sizeof(ZSTD_compressedBlockState_t));
    cctx->entropyWorkspace = (U32*)ZSTD_cwksp_reserve_object(&cctx->workspace, ENTROPY_WORKSPACE_SIZE);
    cctx->bmi2 = ZSTD_cpuid_bmi2(ZSTD_cpuid());
    return cctx;
}